

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O1

void __thiscall
EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction
          (EnvironmentNAVXYTHETALATTICE *this,EnvNAVXYTHETALATAction_t *action)

{
  pointer *ppsVar1;
  char cVar2;
  int iVar3;
  pointer psVar4;
  iterator iVar5;
  pointer psVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  sbpl_xy_theta_cell_t local_50;
  sbpl_xy_theta_cell_t local_40;
  
  local_50.x = 0;
  local_50.y = 0;
  local_40.x = 0;
  local_40.y = 0;
  local_40.theta = 0;
  psVar6 = (action->intersectingcellsV).
           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)(action->intersectingcellsV).
                super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)psVar6 >> 3;
  if (0 < (int)uVar9) {
    uVar11 = 0;
    do {
      local_50.theta = (int)action->starttheta;
      uVar10 = uVar11;
      if (uVar9 <= uVar11) goto LAB_00125efc;
      local_50.y = -psVar6[uVar11].y;
      local_50.x = -psVar6[uVar11].x;
      if (this->bUseNonUniformAngles == true) {
        local_40.theta =
             (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])
                       (this,(ulong)(uint)(int)action->endtheta);
      }
      else {
        cVar2 = action->endtheta;
        if (cVar2 < '\0') {
          local_40.theta = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
          local_40.theta = ((int)cVar2 % local_40.theta + local_40.theta) % local_40.theta;
        }
        else {
          local_40.theta = (int)cVar2 % (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
        }
      }
      local_40.x = action->dX + local_50.x;
      local_40.y = action->dY + local_50.y;
      psVar4 = (this->affectedsuccstatesV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar5._M_current =
           (this->affectedsuccstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar10 = ((long)iVar5._M_current - (long)psVar4 >> 2) * -0x5555555555555555;
      uVar8 = (uint)uVar10;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
      }
      else {
        piVar7 = &psVar4->theta;
        uVar9 = 0;
        do {
          if (uVar10 - uVar9 == 0) goto LAB_00125efc;
          if (((((sbpl_xy_theta_cell_t *)(piVar7 + -2))->x == local_40.x) &&
              (piVar7[-1] == local_40.y)) && (*piVar7 == local_40.theta)) goto LAB_00125a8a;
          uVar9 = uVar9 + 1;
          piVar7 = piVar7 + 3;
        } while ((uVar8 & 0x7fffffff) != uVar9);
        uVar9 = uVar10 & 0xffffffff;
      }
LAB_00125a8a:
      if ((uint)uVar9 == uVar8) {
        if (iVar5._M_current ==
            (this->affectedsuccstatesV).
            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
          _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                    ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                     &this->affectedsuccstatesV,iVar5,&local_40);
        }
        else {
          (iVar5._M_current)->theta = local_40.theta;
          (iVar5._M_current)->x = local_40.x;
          (iVar5._M_current)->y = local_40.y;
          ppsVar1 = &(this->affectedsuccstatesV).
                     super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
      }
      psVar4 = (this->affectedpredstatesV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar5._M_current =
           (this->affectedpredstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar10 = ((long)iVar5._M_current - (long)psVar4 >> 2) * -0x5555555555555555;
      uVar8 = (uint)uVar10;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
      }
      else {
        piVar7 = &psVar4->theta;
        uVar9 = 0;
        do {
          if (uVar10 - uVar9 == 0) goto LAB_00125efc;
          if (((((sbpl_xy_theta_cell_t *)(piVar7 + -2))->x == local_50.x) &&
              (piVar7[-1] == local_50.y)) && (*piVar7 == local_50.theta)) goto LAB_00125b2b;
          uVar9 = uVar9 + 1;
          piVar7 = piVar7 + 3;
        } while ((uVar8 & 0x7fffffff) != uVar9);
        uVar9 = uVar10 & 0xffffffff;
      }
LAB_00125b2b:
      if ((uint)uVar9 == uVar8) {
        if (iVar5._M_current ==
            (this->affectedpredstatesV).
            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
          _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                    ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                     &this->affectedpredstatesV,iVar5,&local_50);
        }
        else {
          (iVar5._M_current)->theta = local_50.theta;
          (iVar5._M_current)->x = local_50.x;
          (iVar5._M_current)->y = local_50.y;
          ppsVar1 = &(this->affectedpredstatesV).
                     super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
      }
      uVar11 = uVar11 + 1;
      psVar6 = (action->intersectingcellsV).
               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (long)(action->intersectingcellsV).
                     super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)psVar6;
      uVar9 = (long)uVar10 >> 3;
    } while ((long)uVar11 < (long)(int)(uVar10 >> 3));
  }
  local_50.theta = (int)action->starttheta;
  local_50.x = 0;
  local_50.y = 0;
  if (this->bUseNonUniformAngles == false) {
    iVar3 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
    local_40.theta = (int)action->endtheta % iVar3;
    if (action->endtheta < '\0') {
      local_40.theta = (local_40.theta + iVar3) % iVar3;
    }
  }
  else {
    local_40.theta =
         (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
  }
  local_40.x = action->dX + local_50.x;
  local_40.y = action->dY + local_50.y;
  psVar4 = (this->affectedsuccstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       (this->affectedsuccstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar5._M_current - (long)psVar4 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  else {
    piVar7 = &psVar4->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) goto LAB_00125efc;
      if (((((sbpl_xy_theta_cell_t *)(piVar7 + -2))->x == local_40.x) && (piVar7[-1] == local_40.y))
         && (*piVar7 == local_40.theta)) goto LAB_00125c53;
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
    uVar9 = uVar10 & 0xffffffff;
  }
LAB_00125c53:
  if ((uint)uVar9 == uVar8) {
    if (iVar5._M_current ==
        (this->affectedsuccstatesV).
        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
      _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                 &this->affectedsuccstatesV,iVar5,&local_40);
    }
    else {
      (iVar5._M_current)->theta = local_40.theta;
      (iVar5._M_current)->x = local_40.x;
      (iVar5._M_current)->y = local_40.y;
      ppsVar1 = &(this->affectedsuccstatesV).
                 super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  psVar4 = (this->affectedpredstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       (this->affectedpredstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar5._M_current - (long)psVar4 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  else {
    piVar7 = &psVar4->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) goto LAB_00125efc;
      if (((((sbpl_xy_theta_cell_t *)(piVar7 + -2))->x == local_50.x) && (piVar7[-1] == local_50.y))
         && (*piVar7 == local_50.theta)) goto LAB_00125cfb;
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
    uVar9 = uVar10 & 0xffffffff;
  }
LAB_00125cfb:
  if ((uint)uVar9 == uVar8) {
    if (iVar5._M_current ==
        (this->affectedpredstatesV).
        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
      _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                 &this->affectedpredstatesV,iVar5,&local_50);
    }
    else {
      (iVar5._M_current)->theta = local_50.theta;
      (iVar5._M_current)->x = local_50.x;
      (iVar5._M_current)->y = local_50.y;
      ppsVar1 = &(this->affectedpredstatesV).
                 super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  local_50.theta = (int)action->starttheta;
  local_50.y = -(int)action->dY;
  local_50.x = -(int)action->dX;
  if (this->bUseNonUniformAngles == true) {
    local_40.theta =
         (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
  }
  else {
    iVar3 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
    local_40.theta = (int)action->endtheta % iVar3;
    if (action->endtheta < '\0') {
      local_40.theta = (local_40.theta + iVar3) % iVar3;
    }
  }
  local_40.x = action->dX + local_50.x;
  local_40.y = action->dY + local_50.y;
  psVar4 = (this->affectedsuccstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       (this->affectedsuccstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar5._M_current - (long)psVar4 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  else {
    piVar7 = &psVar4->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) goto LAB_00125efc;
      if (((((sbpl_xy_theta_cell_t *)(piVar7 + -2))->x == local_40.x) && (piVar7[-1] == local_40.y))
         && (*piVar7 == local_40.theta)) goto LAB_00125e12;
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
    uVar9 = uVar10 & 0xffffffff;
  }
LAB_00125e12:
  if ((uint)uVar9 == uVar8) {
    if (iVar5._M_current ==
        (this->affectedsuccstatesV).
        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
      _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                 &this->affectedsuccstatesV,iVar5,&local_40);
    }
    else {
      (iVar5._M_current)->theta = local_40.theta;
      (iVar5._M_current)->x = local_40.x;
      (iVar5._M_current)->y = local_40.y;
      ppsVar1 = &(this->affectedsuccstatesV).
                 super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  psVar4 = (this->affectedpredstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5._M_current =
       (this->affectedpredstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar5._M_current - (long)psVar4 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  else {
    piVar7 = &psVar4->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) {
LAB_00125efc:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10);
      }
      if (((((sbpl_xy_theta_cell_t *)(piVar7 + -2))->x == local_50.x) && (piVar7[-1] == local_50.y))
         && (*piVar7 == local_50.theta)) goto LAB_00125eaf;
      uVar9 = uVar9 + 1;
      piVar7 = piVar7 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
    uVar9 = uVar10 & 0xffffffff;
  }
LAB_00125eaf:
  if ((uint)uVar9 == uVar8) {
    if (iVar5._M_current ==
        (this->affectedpredstatesV).
        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
      _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                 &this->affectedpredstatesV,iVar5,&local_50);
    }
    else {
      (iVar5._M_current)->theta = local_50.theta;
      (iVar5._M_current)->x = local_50.x;
      (iVar5._M_current)->y = local_50.y;
      ppsVar1 = &(this->affectedpredstatesV).
                 super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction(
    EnvNAVXYTHETALATAction_t* action)
{
    int j;

    // iterate over all the cells involved in the action
    sbpl_xy_theta_cell_t startcell3d, endcell3d;
    for (int i = 0; i < (int)action->intersectingcellsV.size(); i++) {
        // compute the translated affected search Pose - what state has an
        // outgoing action whose intersecting cell is at 0,0
        startcell3d.theta = action->starttheta;
        startcell3d.x = -action->intersectingcellsV.at(i).x;
        startcell3d.y = -action->intersectingcellsV.at(i).y;

        // compute the translated affected search Pose - what state has an
        // incoming action whose intersecting cell is at 0,0
        if (bUseNonUniformAngles) {
            endcell3d.theta = normalizeDiscAngle(action->endtheta);
        }
        else {
            endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
        }
        endcell3d.x = startcell3d.x + action->dX;
        endcell3d.y = startcell3d.y + action->dY;

        //store the cells if not already there
        for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
            if (affectedsuccstatesV.at(j) == endcell3d) {
                break;
            }
        }
        if (j == (int)affectedsuccstatesV.size()) {
            affectedsuccstatesV.push_back(endcell3d);
        }

        for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
            if (affectedpredstatesV.at(j) == startcell3d) {
                break;
            }
        }
        if (j == (int)affectedpredstatesV.size()) {
            affectedpredstatesV.push_back(startcell3d);
        }
    } // over intersecting cells

    // add the centers since with h2d we are using these in cost computations
    // ---intersecting cell = origin
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -0;
    startcell3d.y = -0;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    //store the cells if not already there
    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }

    //---intersecting cell = outcome state
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -action->dX;
    startcell3d.y = -action->dY;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }
}